

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_color_pick(nk_context *ctx,nk_color *color,nk_color_format fmt)

{
  long lVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  nk_user_font *pnVar4;
  float *pfVar5;
  nk_widget_layout_states nVar6;
  int iVar7;
  nk_color nVar8;
  long lVar9;
  void *pvVar10;
  undefined2 uVar11;
  uint uVar12;
  nk_command_buffer *b;
  nk_widget_layout_states nVar13;
  nk_flags *state;
  nk_context *i;
  float fVar14;
  float fVar15;
  nk_rect r;
  nk_rect r_00;
  nk_rect r_01;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  float hsva [4];
  float a;
  nk_rect bounds;
  float local_168;
  float local_164;
  float local_160;
  float local_15c [4];
  nk_color_format local_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  ulong local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  float *local_f0;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  ulong local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_6c;
  undefined1 local_68 [16];
  nk_rect local_58;
  undefined1 local_48 [16];
  float local_38;
  float local_34;
  
  local_14c = fmt;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5491,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  if (color == (nk_color *)0x0) {
    __assert_fail("color",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5492,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  pnVar2 = ctx->current;
  if (pnVar2 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5493,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  pnVar3 = pnVar2->layout;
  if (pnVar3 != (nk_panel *)0x0) {
    nVar6 = nk_widget(&local_58,ctx);
    if (nVar6 != NK_WIDGET_INVALID) {
      i = (nk_context *)0x0;
      if ((nVar6 != NK_WIDGET_ROM) && ((pnVar3->flags & 0x1000) == 0)) {
        i = ctx;
      }
      pnVar4 = (ctx->style).font;
      if (pnVar4 == (nk_user_font *)0x0) {
        __assert_fail("font",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x4028,
                      "int nk_do_color_picker(nk_flags *, struct nk_command_buffer *, struct nk_color *, enum nk_color_format, struct nk_rect, struct nk_vec2, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      state = &ctx->last_widget_state;
      local_138 = local_58.h;
      local_38 = pnVar4->height;
      local_d8 = local_58.y;
      local_108._0_4_ = local_58.x + 0.0;
      local_108._4_8_ = (ulong)local_58._0_8_ >> 0x20;
      local_108._12_4_ = 0;
      local_118._0_4_ = local_58.x;
      local_118._4_4_ = local_58.y;
      uStack_110 = 0;
      fStack_94 = local_d8 + 0.0;
      fVar14 = local_38 + local_38 + 0.0;
      local_e8._0_4_ = local_58.w - fVar14;
      register0x00001244 = (ulong)local_58._8_8_ >> 0x20;
      fStack_dc = 0.0;
      local_a8 = CONCAT44(local_138,local_58.w - fVar14);
      uStack_a0 = 0;
      local_c8._0_4_ = local_58.w;
      local_c8._4_4_ = local_58.h;
      uStack_c0 = 0;
      local_b8 = CONCAT44(local_138,local_38);
      uStack_b0 = 0;
      local_128._0_4_ = (float)local_108._0_4_ + (float)local_e8._0_4_;
      register0x000012c4 = (ulong)local_58._0_8_ >> 0x20;
      fStack_11c = 0.0;
      local_68 = ZEXT416((uint)local_38);
      local_38 = local_38 + (float)local_128._0_4_;
      local_48 = ZEXT416((uint)local_38);
      local_148._4_4_ = local_d8;
      local_148._0_4_ = fStack_94;
      fStack_140 = local_d8;
      fStack_13c = local_d8;
      nVar13 = NK_WIDGET_INVALID;
      local_f0 = &local_38;
      if (local_14c != NK_RGBA) {
        local_f0 = (float *)0x0;
      }
      fStack_134 = local_138;
      fStack_130 = local_138;
      fStack_12c = local_138;
      fStack_d4 = local_d8;
      fStack_d0 = local_d8;
      fStack_cc = local_d8;
      local_98 = (float)local_108._0_4_;
      fStack_90 = local_d8;
      fStack_8c = local_d8;
      local_88 = (float)local_128._0_4_;
      fStack_84 = fStack_94;
      fStack_80 = local_d8;
      fStack_7c = local_d8;
      local_34 = fStack_94;
      nk_color_hsva_f(&local_168,&local_164,&local_160,local_15c,*color);
      r.y = fStack_94;
      r.x = local_98;
      r.w = (float)(undefined4)local_a8;
      r.h = (float)local_a8._4_4_;
      iVar7 = nk_button_behavior(state,r,&i->input,NK_BUTTON_REPEATER);
      if (iVar7 != 0) {
        fVar15 = ((i->input).mouse.pos.x - (float)local_108._0_4_) / ((float)local_e8._0_4_ + -1.0);
        local_164 = (float)(-(uint)(1.0 < fVar15) & 0x3f800000 |
                           ~-(uint)(1.0 < fVar15) & -(uint)(0.0 < fVar15) & 0x3f800000);
        fVar14 = fVar15;
        if (fVar15 <= 0.0) {
          fVar14 = local_164;
        }
        if (fVar15 <= 1.0) {
          local_164 = fVar14;
        }
        fVar15 = ((i->input).mouse.pos.y - (float)local_148._0_4_) / (local_138 + -1.0);
        local_160 = (float)(-(uint)(1.0 < fVar15) & 0x3f800000 |
                           ~-(uint)(1.0 < fVar15) & -(uint)(0.0 < fVar15) & 0x3f800000);
        fVar14 = fVar15;
        if (fVar15 <= 0.0) {
          fVar14 = local_160;
        }
        if (fVar15 <= 1.0) {
          local_160 = fVar14;
        }
        local_160 = 1.0 - local_160;
        nVar13 = NK_WIDGET_VALID;
      }
      r_00.y = fStack_84;
      r_00.x = local_88;
      r_00.w = (float)(undefined4)local_b8;
      r_00.h = (float)local_b8._4_4_;
      iVar7 = nk_button_behavior(state,r_00,&i->input,NK_BUTTON_REPEATER);
      if (iVar7 != 0) {
        fVar15 = ((i->input).mouse.pos.y - (float)local_148._0_4_) / (local_138 + -1.0);
        local_168 = (float)(-(uint)(1.0 < fVar15) & 0x3f800000 |
                           ~-(uint)(1.0 < fVar15) & -(uint)(0.0 < fVar15) & 0x3f800000);
        fVar14 = fVar15;
        if (fVar15 <= 0.0) {
          fVar14 = local_168;
        }
        if (fVar15 <= 1.0) {
          local_168 = fVar14;
        }
        nVar13 = NK_WIDGET_VALID;
      }
      nVar6 = nVar13;
      if ((local_14c == NK_RGBA) &&
         (r_01.w = (float)(undefined4)local_b8, r_01.h = (float)local_b8._4_4_, r_01.x = local_f0[0]
         , r_01.y = local_f0[1], iVar7 = nk_button_behavior(state,r_01,&i->input,NK_BUTTON_REPEATER)
         , iVar7 != 0)) {
        fVar15 = ((i->input).mouse.pos.y - (float)local_148._0_4_) / (local_138 + -1.0);
        local_15c[0] = (float)(-(uint)(1.0 < fVar15) & 0x3f800000 |
                              ~-(uint)(1.0 < fVar15) & -(uint)(0.0 < fVar15) & 0x3f800000);
        fVar14 = fVar15;
        if (fVar15 <= 0.0) {
          fVar14 = local_15c[0];
        }
        if (fVar15 <= 1.0) {
          local_15c[0] = fVar14;
        }
        local_15c[0] = 1.0 - local_15c[0];
        nVar6 = NK_WIDGET_VALID;
      }
      *state = *state & 2 | 4;
      if (nVar13 != NK_WIDGET_INVALID) {
        nVar8 = nk_hsva_f(local_168,local_164,local_160,local_15c[0]);
        *color = nVar8;
        *state = 0x22;
      }
      if (nVar6 != NK_WIDGET_INVALID) {
        color->a = (nk_byte)(int)(local_15c[0] * 255.0);
        *state = 0x22;
      }
      if ((((i != (nk_context *)0x0) &&
           (fVar14 = (i->input).mouse.pos.x, (float)local_118 <= fVar14)) &&
          (fVar14 < (float)local_108._0_4_ + (float)local_c8)) &&
         ((fVar14 = (i->input).mouse.pos.y, local_d8 <= fVar14 &&
          (fVar14 < (float)local_148._0_4_ + local_138)))) {
        *state = 0x12;
      }
      if ((((*state & 0x10) != 0) &&
          (((uVar12 = 8, i == (nk_context *)0x0 ||
            (fVar14 = (i->input).mouse.prev.x, fVar14 < (float)local_118)) ||
           (((float)local_108._0_4_ + (float)local_c8 <= fVar14 ||
            ((fVar14 = (i->input).mouse.prev.y, fVar14 < local_d8 ||
             ((float)local_148._0_4_ + local_138 <= fVar14)))))))) ||
         ((i != (nk_context *)0x0 &&
          ((((fVar14 = (i->input).mouse.prev.x, (float)local_118 <= fVar14 &&
             (fVar14 < (float)local_c8 + (float)local_108._0_4_)) &&
            (fVar14 = (i->input).mouse.prev.y, local_d8 <= fVar14)) &&
           (uVar12 = 0x40, fVar14 < (float)local_148._0_4_ + local_138)))))) {
        *state = *state | uVar12;
      }
      b = &pnVar2->buffer;
      nVar8 = *color;
      nk_color_hsva_f(&local_168,&local_164,&local_160,&local_6c,nVar8);
      fStack_84 = local_138 / 6.0 + 0.5;
      local_88 = (float)local_68._0_4_;
      fStack_80 = (float)local_68._8_4_;
      fStack_7c = (float)local_68._12_4_;
      lVar9 = 0;
      local_118._0_4_ = local_138 / 6.0;
      do {
        lVar1 = lVar9 + 1;
        rect.h = fStack_84;
        rect.w = local_88;
        rect.y = (float)(int)lVar9 * (float)local_118 + (float)local_148._0_4_ + 0.5;
        rect.x = (float)local_128._0_4_;
        nk_fill_rect_multi_color
                  (b,rect,*(nk_color *)(&nk_draw_color_picker_hue_colors + lVar9),
                   *(nk_color *)(&nk_draw_color_picker_hue_colors + lVar9),
                   *(nk_color *)(&DAT_0015d554 + lVar9),*(nk_color *)(&DAT_0015d554 + lVar9));
        lVar9 = lVar1;
      } while (lVar1 != 6);
      local_118 = CONCAT44(local_118._4_4_,local_168);
      pvVar10 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      pfVar5 = local_f0;
      if (pvVar10 != (void *)0x0) {
        *(undefined2 *)((long)pvVar10 + 0x10) = 1;
        *(short *)((long)pvVar10 + 0x12) = (short)(int)((float)local_128._0_4_ + -1.0);
        uVar11 = (undefined2)(int)((float)local_118 * local_138 + (float)local_148._0_4_ + 0.5);
        *(undefined2 *)((long)pvVar10 + 0x14) = uVar11;
        *(short *)((long)pvVar10 + 0x16) = (short)(int)((float)local_48._0_4_ + 2.0);
        *(undefined2 *)((long)pvVar10 + 0x18) = uVar11;
        *(undefined4 *)((long)pvVar10 + 0x1a) = 0xffffffff;
      }
      if (local_14c == NK_RGBA) {
        rect_00.w = (float)(undefined4)local_b8;
        rect_00.h = (float)local_b8._4_4_;
        rect_00.x = local_f0[0];
        rect_00.y = local_f0[1];
        nk_fill_rect_multi_color
                  (b,rect_00,(nk_color)0xffffffff,(nk_color)0xffffffff,(nk_color)0xff000000,
                   (nk_color)0xff000000);
        local_128._0_4_ = *pfVar5;
        pvVar10 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
        if (pvVar10 != (void *)0x0) {
          fVar15 = (float)((uint)nVar8 >> 0x18) / 255.0;
          fVar14 = 1.0;
          if (fVar15 <= 1.0) {
            fVar14 = fVar15;
          }
          if (fVar14 <= 0.0) {
            fVar14 = 0.0;
          }
          *(undefined2 *)((long)pvVar10 + 0x10) = 1;
          *(short *)((long)pvVar10 + 0x12) = (short)(int)((float)local_128._0_4_ + -1.0);
          uVar11 = (undefined2)(int)((1.0 - fVar14) * local_138 + (float)local_148._0_4_ + 0.5);
          *(undefined2 *)((long)pvVar10 + 0x14) = uVar11;
          *(short *)((long)pvVar10 + 0x16) =
               (short)(int)((float)local_68._0_4_ + (float)local_128._0_4_ + 2.0);
          *(undefined2 *)((long)pvVar10 + 0x18) = uVar11;
          *(undefined4 *)((long)pvVar10 + 0x1a) = 0xffffffff;
        }
      }
      nVar8 = nk_hsva_f((float)local_118,1.0,1.0,1.0);
      rect_01.y = fStack_94;
      rect_01.x = local_98;
      rect_01.w = (float)(undefined4)local_a8;
      rect_01.h = (float)local_a8._4_4_;
      nk_fill_rect_multi_color(b,rect_01,(nk_color)0xffffffff,nVar8,nVar8,(nk_color)0xffffffff);
      rect_02.y = fStack_94;
      rect_02.x = local_98;
      rect_02.w = (float)(undefined4)local_a8;
      rect_02.h = (float)local_a8._4_4_;
      nk_fill_rect_multi_color
                (b,rect_02,(nk_color)0x0,(nk_color)0x0,(nk_color)0xff000000,(nk_color)0xff000000);
      local_e8._0_4_ = (float)local_e8._0_4_ * local_164 + (float)local_108._0_4_;
      local_128._4_4_ = (float)(int)(float)local_e8._4_4_;
      local_128._0_4_ = (float)(int)(float)local_e8._0_4_;
      fStack_120 = (float)(int)fStack_e0;
      fStack_11c = (float)(int)fStack_dc;
      fVar14 = (1.0 - local_160) * local_138 + (float)local_148._0_4_;
      _local_148 = ZEXT416((uint)(int)fVar14);
      pvVar10 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      uVar11 = (undefined2)(int)fVar14;
      if (pvVar10 != (void *)0x0) {
        *(undefined2 *)((long)pvVar10 + 0x10) = 1;
        *(short *)((long)pvVar10 + 0x12) = (short)(int)((float)local_128._0_4_ + -7.0);
        *(undefined2 *)((long)pvVar10 + 0x14) = uVar11;
        *(short *)((long)pvVar10 + 0x16) = (short)(int)((float)local_128._0_4_ + -2.0);
        *(undefined2 *)((long)pvVar10 + 0x18) = uVar11;
        *(undefined4 *)((long)pvVar10 + 0x1a) = 0xffffffff;
      }
      local_148._4_4_ = (float)(int)local_148._4_4_;
      local_148._0_4_ = (float)(int)local_148._0_4_;
      fStack_140 = (float)(int)fStack_140;
      fStack_13c = (float)(int)fStack_13c;
      pvVar10 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar10 != (void *)0x0) {
        *(undefined2 *)((long)pvVar10 + 0x10) = 1;
        *(short *)((long)pvVar10 + 0x12) = (short)(int)((float)local_128._0_4_ + 7.0 + 1.0);
        *(undefined2 *)((long)pvVar10 + 0x14) = uVar11;
        *(short *)((long)pvVar10 + 0x16) = (short)(int)((float)local_128._0_4_ + 3.0);
        *(undefined2 *)((long)pvVar10 + 0x18) = uVar11;
        *(undefined4 *)((long)pvVar10 + 0x1a) = 0xffffffff;
      }
      iVar7 = (int)(float)local_e8._0_4_;
      pvVar10 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      uVar11 = (undefined2)iVar7;
      if (pvVar10 != (void *)0x0) {
        *(undefined2 *)((long)pvVar10 + 0x10) = 1;
        *(undefined2 *)((long)pvVar10 + 0x12) = uVar11;
        *(short *)((long)pvVar10 + 0x14) = (short)(int)((float)local_148._0_4_ + 7.0 + 1.0);
        *(undefined2 *)((long)pvVar10 + 0x16) = uVar11;
        *(short *)((long)pvVar10 + 0x18) = (short)(int)((float)local_148._0_4_ + 3.0);
        *(undefined4 *)((long)pvVar10 + 0x1a) = 0xffffffff;
      }
      pvVar10 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar10 != (void *)0x0) {
        *(undefined2 *)((long)pvVar10 + 0x10) = 1;
        *(undefined2 *)((long)pvVar10 + 0x12) = uVar11;
        *(short *)((long)pvVar10 + 0x14) = (short)(int)((float)local_148._0_4_ + -7.0);
        *(undefined2 *)((long)pvVar10 + 0x16) = uVar11;
        *(short *)((long)pvVar10 + 0x18) = (short)(int)((float)local_148._0_4_ + -2.0);
        *(undefined4 *)((long)pvVar10 + 0x1a) = 0xffffffff;
      }
    }
    return nVar6;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x5494,
                "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)");
}

Assistant:

NK_API int
nk_color_pick(struct nk_context * ctx, struct nk_color *color,
    enum nk_color_format fmt)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *config;
    const struct nk_input *in;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(color);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !color)
        return 0;

    win = ctx->current;
    config = &ctx->style;
    layout = win->layout;
    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_color_picker(&ctx->last_widget_state, &win->buffer, color, fmt, bounds,
                nk_vec2(0,0), in, config->font);
}